

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> * __thiscall
testing::internal::FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)>::
FindOnCallSpec(FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)> *this,
              ArgumentTuple *args)

{
  bool bVar1;
  reference ppvVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
  *in_RDI;
  OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *spec;
  const_reverse_iterator it;
  OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *in_stack_ffffffffffffffd0;
  ArgumentTuple *in_stack_ffffffffffffffd8;
  OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *in_stack_ffffffffffffffe0;
  
  std::vector<const_void_*,_std::allocator<const_void_*>_>::rbegin
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)in_stack_ffffffffffffffd8);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::rend
              ((vector<const_void_*,_std::allocator<const_void_*>_> *)in_stack_ffffffffffffffd8);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                             *)in_stack_ffffffffffffffd0,in_RDI);
    if (!bVar1) {
      return (OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *)0x0;
    }
    ppvVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                           *)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 =
         (OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *)*ppvVar2;
    bVar1 = OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)>::Matches
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>_>
                  *)in_stack_ffffffffffffffd0);
  }
  return in_stack_ffffffffffffffd0;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(
      const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it
             = untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args))
        return spec;
    }

    return NULL;
  }